

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocationpool.h
# Opt level: O1

void __thiscall
rengine::AllocationPool<rengine::TextureNode>::setMemory
          (AllocationPool<rengine::TextureNode> *this,void *m,uint blockCount)

{
  uint *puVar1;
  ulong uVar2;
  
  if (this->m_memory != (TextureNode *)0x0) {
    __assert_fail("m_memory == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x31,
                  "void rengine::AllocationPool<rengine::TextureNode>::setMemory(void *, unsigned int) [T = rengine::TextureNode]"
                 );
  }
  if (this->m_free != (uint *)0x0) {
    __assert_fail("m_free == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x32,
                  "void rengine::AllocationPool<rengine::TextureNode>::setMemory(void *, unsigned int) [T = rengine::TextureNode]"
                 );
  }
  if (this->m_nextFree != 0) {
    __assert_fail("m_nextFree == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x33,
                  "void rengine::AllocationPool<rengine::TextureNode>::setMemory(void *, unsigned int) [T = rengine::TextureNode]"
                 );
  }
  if (this->m_poolSize == 0) {
    this->m_poolSize = blockCount;
    this->m_memory = (TextureNode *)m;
    puVar1 = (uint *)((ulong)blockCount * 0x50 + (long)m);
    this->m_free = puVar1;
    this->m_nextFree = 0;
    if (blockCount != 0) {
      uVar2 = 0;
      do {
        puVar1[uVar2] = (uint)uVar2;
        uVar2 = uVar2 + 1;
      } while (blockCount != uVar2);
    }
    return;
  }
  __assert_fail("m_poolSize == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                ,0x34,
                "void rengine::AllocationPool<rengine::TextureNode>::setMemory(void *, unsigned int) [T = rengine::TextureNode]"
               );
}

Assistant:

void setMemory(void *m, unsigned blockCount) {
        assert(m_memory == 0);
        assert(m_free == 0);
        assert(m_nextFree == 0);
        assert(m_poolSize == 0);

        m_poolSize = blockCount;
        m_memory = (T *) m;
        m_free = (unsigned *) (m_memory + blockCount);
        m_nextFree = 0;
        for (unsigned i=0; i<blockCount; ++i)
            m_free[i] = i;
    }